

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall rcg::Stream::~Stream(Stream *this)

{
  element_type *peVar1;
  Buffer *in_RDI;
  Stream *in_stack_00000140;
  
  stopStreaming(in_stack_00000140);
  if (in_RDI[2].nodemap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11e1fe);
    (*peVar1->DSClose)(in_RDI[2].nodemap.
                       super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  }
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x11e24c);
  std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x11e25d);
  std::__cxx11::string::~string((string *)&in_RDI[1].nodemap);
  std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x11e27c);
  std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x11e28a);
  Buffer::~Buffer(in_RDI);
  std::enable_shared_from_this<rcg::Stream>::~enable_shared_from_this
            ((enable_shared_from_this<rcg::Stream> *)0x11e2a2);
  return;
}

Assistant:

Stream::~Stream()
{
  try
  {
    stopStreaming();
  }
  catch (...) // do not throw exceptions in destructor
  { }

  try
  {
    if (stream != 0)
    {
      gentl->DSClose(stream);
    }
  }
  catch (...) // do not throw exceptions in destructor
  { }
}